

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void jpgd::DCT_Upsample::P_Q<5,_6>::calc(Matrix44 *P,Matrix44 *Q,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  
  sVar1 = pSrc[1];
  sVar2 = pSrc[3];
  sVar3 = pSrc[5];
  sVar4 = pSrc[9];
  sVar5 = pSrc[0xb];
  sVar6 = pSrc[0xd];
  sVar7 = pSrc[0x19];
  sVar8 = pSrc[0x1b];
  sVar9 = pSrc[0x1d];
  sVar10 = pSrc[0x21];
  sVar11 = pSrc[0x23];
  sVar12 = pSrc[0x25];
  iVar24 = (int)pSrc[8];
  sVar13 = pSrc[0x10];
  iVar21 = (int)pSrc[0x18];
  sVar14 = pSrc[0x20];
  sVar15 = pSrc[0x11];
  sVar16 = pSrc[0x13];
  sVar17 = pSrc[0x15];
  sVar18 = pSrc[4];
  iVar27 = (int)pSrc[0xc];
  sVar19 = pSrc[0x14];
  iVar28 = (int)pSrc[0x1c];
  sVar20 = pSrc[0x24];
  P->v[0][0] = (int)*pSrc;
  P->v[0][1] = iVar21 * 0x32a + iVar24 * 0x1aa + 0x200 >> 10;
  P->v[0][2] = (int)sVar14;
  P->v[0][3] = iVar21 * -99 + iVar24 * 0x17 + 0x200 >> 10;
  P->v[1][0] = sVar3 * -0x168 + 0x200 + sVar2 * 0x32a + sVar1 * 0x1aa >> 10;
  iVar23 = sVar6 * -0x168 + 0x200 + sVar5 * 0x32a + sVar4 * 0x1aa >> 10;
  iVar22 = sVar9 * -0x168 + 0x200 + sVar8 * 0x32a + sVar7 * 0x1aa >> 10;
  P->v[1][1] = iVar22 * 0x32a + iVar23 * 0x1aa + 0x200 >> 10;
  P->v[1][2] = sVar12 * -0x168 + 0x200 + sVar11 * 0x32a + sVar10 * 0x1aa >> 10;
  P->v[1][3] = iVar22 * -99 + iVar23 * 0x17 + 0x200 >> 10;
  P->v[2][0] = (int)sVar18;
  P->v[2][1] = iVar28 * 0x32a + iVar27 * 0x1aa + 0x200 >> 10;
  P->v[2][2] = (int)sVar20;
  P->v[2][3] = iVar28 * -99 + iVar27 * 0x17 + 0x200 >> 10;
  P->v[3][0] = sVar3 * 0x1f6 + 0x200 + sVar2 * -99 + sVar1 * 0x17 >> 10;
  iVar26 = sVar6 * 0x1f6 + 0x200 + sVar5 * -99 + sVar4 * 0x17 >> 10;
  iVar25 = sVar9 * 0x1f6 + 0x200 + sVar8 * -99 + sVar7 * 0x17 >> 10;
  P->v[3][1] = iVar25 * 0x32a + iVar26 * 0x1aa + 0x200 >> 10;
  P->v[3][2] = sVar12 * 0x1f6 + 0x200 + sVar11 * -99 + sVar10 * 0x17 >> 10;
  P->v[3][3] = iVar25 * -99 + iVar26 * 0x17 + 0x200 >> 10;
  Q->v[0][0] = iVar21 * -0x145 + iVar24 * 0x3a0 + 0x200 >> 10;
  Q->v[0][1] = (int)sVar13;
  Q->v[0][2] = iVar21 * 0x20e + iVar24 * -0x4b + 0x200 >> 10;
  Q->v[0][3] = 0;
  Q->v[1][0] = iVar22 * -0x145 + iVar23 * 0x3a0 + 0x200 >> 10;
  Q->v[1][1] = sVar17 * -0x168 + 0x200 + sVar16 * 0x32a + sVar15 * 0x1aa >> 10;
  Q->v[1][2] = iVar22 * 0x20e + iVar23 * -0x4b + 0x200 >> 10;
  Q->v[1][3] = 0;
  Q->v[2][0] = iVar28 * -0x145 + iVar27 * 0x3a0 + 0x200 >> 10;
  Q->v[2][1] = (int)sVar19;
  Q->v[2][2] = iVar28 * 0x20e + iVar27 * -0x4b + 0x200 >> 10;
  Q->v[2][3] = 0;
  Q->v[3][0] = iVar25 * -0x145 + iVar26 * 0x3a0 + 0x200 >> 10;
  Q->v[3][1] = sVar17 * 0x1f6 + 0x200 + sVar16 * -99 + sVar15 * 0x17 >> 10;
  Q->v[3][2] = iVar25 * 0x20e + iVar26 * -0x4b + 0x200 >> 10;
  Q->v[3][3] = 0;
  return;
}

Assistant:

static void calc(Matrix44& P, Matrix44& Q, const jpgd_block_t* pSrc)
    {
      // 4x8 = 4x8 times 8x8, matrix 0 is constant
      const Temp_Type X000 = AT(0, 0);
      const Temp_Type X001 = AT(0, 1);
      const Temp_Type X002 = AT(0, 2);
      const Temp_Type X003 = AT(0, 3);
      const Temp_Type X004 = AT(0, 4);
      const Temp_Type X005 = AT(0, 5);
      const Temp_Type X006 = AT(0, 6);
      const Temp_Type X007 = AT(0, 7);
      const Temp_Type X010 = D(F(0.415735f) * AT(1, 0) + F(0.791065f) * AT(3, 0) + F(-0.352443f) * AT(5, 0) + F(0.277785f) * AT(7, 0));
      const Temp_Type X011 = D(F(0.415735f) * AT(1, 1) + F(0.791065f) * AT(3, 1) + F(-0.352443f) * AT(5, 1) + F(0.277785f) * AT(7, 1));
      const Temp_Type X012 = D(F(0.415735f) * AT(1, 2) + F(0.791065f) * AT(3, 2) + F(-0.352443f) * AT(5, 2) + F(0.277785f) * AT(7, 2));
      const Temp_Type X013 = D(F(0.415735f) * AT(1, 3) + F(0.791065f) * AT(3, 3) + F(-0.352443f) * AT(5, 3) + F(0.277785f) * AT(7, 3));
      const Temp_Type X014 = D(F(0.415735f) * AT(1, 4) + F(0.791065f) * AT(3, 4) + F(-0.352443f) * AT(5, 4) + F(0.277785f) * AT(7, 4));
      const Temp_Type X015 = D(F(0.415735f) * AT(1, 5) + F(0.791065f) * AT(3, 5) + F(-0.352443f) * AT(5, 5) + F(0.277785f) * AT(7, 5));
      const Temp_Type X016 = D(F(0.415735f) * AT(1, 6) + F(0.791065f) * AT(3, 6) + F(-0.352443f) * AT(5, 6) + F(0.277785f) * AT(7, 6));
      const Temp_Type X017 = D(F(0.415735f) * AT(1, 7) + F(0.791065f) * AT(3, 7) + F(-0.352443f) * AT(5, 7) + F(0.277785f) * AT(7, 7));
      const Temp_Type X020 = AT(4, 0);
      const Temp_Type X021 = AT(4, 1);
      const Temp_Type X022 = AT(4, 2);
      const Temp_Type X023 = AT(4, 3);
      const Temp_Type X024 = AT(4, 4);
      const Temp_Type X025 = AT(4, 5);
      const Temp_Type X026 = AT(4, 6);
      const Temp_Type X027 = AT(4, 7);
      const Temp_Type X030 = D(F(0.022887f) * AT(1, 0) + F(-0.097545f) * AT(3, 0) + F(0.490393f) * AT(5, 0) + F(0.865723f) * AT(7, 0));
      const Temp_Type X031 = D(F(0.022887f) * AT(1, 1) + F(-0.097545f) * AT(3, 1) + F(0.490393f) * AT(5, 1) + F(0.865723f) * AT(7, 1));
      const Temp_Type X032 = D(F(0.022887f) * AT(1, 2) + F(-0.097545f) * AT(3, 2) + F(0.490393f) * AT(5, 2) + F(0.865723f) * AT(7, 2));
      const Temp_Type X033 = D(F(0.022887f) * AT(1, 3) + F(-0.097545f) * AT(3, 3) + F(0.490393f) * AT(5, 3) + F(0.865723f) * AT(7, 3));
      const Temp_Type X034 = D(F(0.022887f) * AT(1, 4) + F(-0.097545f) * AT(3, 4) + F(0.490393f) * AT(5, 4) + F(0.865723f) * AT(7, 4));
      const Temp_Type X035 = D(F(0.022887f) * AT(1, 5) + F(-0.097545f) * AT(3, 5) + F(0.490393f) * AT(5, 5) + F(0.865723f) * AT(7, 5));
      const Temp_Type X036 = D(F(0.022887f) * AT(1, 6) + F(-0.097545f) * AT(3, 6) + F(0.490393f) * AT(5, 6) + F(0.865723f) * AT(7, 6));
      const Temp_Type X037 = D(F(0.022887f) * AT(1, 7) + F(-0.097545f) * AT(3, 7) + F(0.490393f) * AT(5, 7) + F(0.865723f) * AT(7, 7));

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      P.at(0, 0) = X000;
      P.at(0, 1) = D(X001 * F(0.415735f) + X003 * F(0.791065f) + X005 * F(-0.352443f) + X007 * F(0.277785f));
      P.at(0, 2) = X004;
      P.at(0, 3) = D(X001 * F(0.022887f) + X003 * F(-0.097545f) + X005 * F(0.490393f) + X007 * F(0.865723f));
      P.at(1, 0) = X010;
      P.at(1, 1) = D(X011 * F(0.415735f) + X013 * F(0.791065f) + X015 * F(-0.352443f) + X017 * F(0.277785f));
      P.at(1, 2) = X014;
      P.at(1, 3) = D(X011 * F(0.022887f) + X013 * F(-0.097545f) + X015 * F(0.490393f) + X017 * F(0.865723f));
      P.at(2, 0) = X020;
      P.at(2, 1) = D(X021 * F(0.415735f) + X023 * F(0.791065f) + X025 * F(-0.352443f) + X027 * F(0.277785f));
      P.at(2, 2) = X024;
      P.at(2, 3) = D(X021 * F(0.022887f) + X023 * F(-0.097545f) + X025 * F(0.490393f) + X027 * F(0.865723f));
      P.at(3, 0) = X030;
      P.at(3, 1) = D(X031 * F(0.415735f) + X033 * F(0.791065f) + X035 * F(-0.352443f) + X037 * F(0.277785f));
      P.at(3, 2) = X034;
      P.at(3, 3) = D(X031 * F(0.022887f) + X033 * F(-0.097545f) + X035 * F(0.490393f) + X037 * F(0.865723f));
      // 40 muls 24 adds

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      Q.at(0, 0) = D(X001 * F(0.906127f) + X003 * F(-0.318190f) + X005 * F(0.212608f) + X007 * F(-0.180240f));
      Q.at(0, 1) = X002;
      Q.at(0, 2) = D(X001 * F(-0.074658f) + X003 * F(0.513280f) + X005 * F(0.768178f) + X007 * F(-0.375330f));
      Q.at(0, 3) = X006;
      Q.at(1, 0) = D(X011 * F(0.906127f) + X013 * F(-0.318190f) + X015 * F(0.212608f) + X017 * F(-0.180240f));
      Q.at(1, 1) = X012;
      Q.at(1, 2) = D(X011 * F(-0.074658f) + X013 * F(0.513280f) + X015 * F(0.768178f) + X017 * F(-0.375330f));
      Q.at(1, 3) = X016;
      Q.at(2, 0) = D(X021 * F(0.906127f) + X023 * F(-0.318190f) + X025 * F(0.212608f) + X027 * F(-0.180240f));
      Q.at(2, 1) = X022;
      Q.at(2, 2) = D(X021 * F(-0.074658f) + X023 * F(0.513280f) + X025 * F(0.768178f) + X027 * F(-0.375330f));
      Q.at(2, 3) = X026;
      Q.at(3, 0) = D(X031 * F(0.906127f) + X033 * F(-0.318190f) + X035 * F(0.212608f) + X037 * F(-0.180240f));
      Q.at(3, 1) = X032;
      Q.at(3, 2) = D(X031 * F(-0.074658f) + X033 * F(0.513280f) + X035 * F(0.768178f) + X037 * F(-0.375330f));
      Q.at(3, 3) = X036;
      // 40 muls 24 adds
    }